

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

int anon_unknown.dwarf_ebbd96::ParseIndex
              (string *str,optional<(anonymous_namespace)::Args> *progress,ArrayIndex max)

{
  bool bVar1;
  runtime_error *prVar2;
  unsigned_long lindex;
  string local_e8;
  static_string_view local_c8;
  undefined8 local_b8;
  static_string_view local_a8;
  cmAlphaNum sizeStr;
  static_string_view local_60;
  static_string_view local_50;
  string_view local_40;
  
  bVar1 = cmStrToULong(str,&lindex);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_c8.super_string_view._M_len = 0x1f;
    local_c8.super_string_view._M_str = "expected an array index, got: \'";
    local_a8.super_string_view._M_len = 1;
    local_a8.super_string_view._M_str = "\'";
    cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
              ((string *)&sizeStr,&local_c8,str,&local_a8);
    local_e8.field_2._M_allocated_capacity =
         *(undefined8 *)
          &(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
           super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged;
    local_e8._M_dataplus._M_p =
         *(pointer *)
          &(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
           super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload;
    local_e8._M_string_length =
         *(size_type *)
          ((long)&(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>).
                  _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload +
          8);
    std::runtime_error::runtime_error(prVar2,(string *)&sizeStr);
    *(undefined ***)prVar2 = &PTR__runtime_error_009902b8;
    *(undefined4 *)(prVar2 + 0x10) = local_e8._M_dataplus._M_p._0_4_;
    *(undefined4 *)(prVar2 + 0x14) = local_e8._M_dataplus._M_p._4_4_;
    *(undefined4 *)(prVar2 + 0x18) = (undefined4)local_e8._M_string_length;
    *(undefined4 *)(prVar2 + 0x1c) = local_e8._M_string_length._4_4_;
    *(size_type *)(prVar2 + 0x20) = local_e8.field_2._M_allocated_capacity;
    __cxa_throw(prVar2,&(anonymous_namespace)::json_error::typeinfo,
                std::runtime_error::~runtime_error);
  }
  if ((uint)lindex < max) {
    return (uint)lindex;
  }
  cmAlphaNum::cmAlphaNum(&sizeStr,max);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_a8.super_string_view._M_len = 0x1c;
  local_a8.super_string_view._M_str = "expected an index less than ";
  local_40 = cmAlphaNum::View(&sizeStr);
  local_50.super_string_view._M_len = 6;
  local_50.super_string_view._M_str = " got \'";
  local_60.super_string_view._M_len = 1;
  local_60.super_string_view._M_str = "\'";
  cmStrCat<cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
            (&local_e8,&local_a8,&local_40,&local_50,str,&local_60);
  local_b8 = *(undefined8 *)
              &(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
               super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged;
  local_c8.super_string_view._M_len =
       *(size_t *)
        &(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>)._M_payload.
         super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload;
  local_c8.super_string_view._M_str =
       *(char **)((long)&(progress->super__Optional_base<(anonymous_namespace)::Args,_true,_true>).
                         _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>.
                         _M_payload + 8);
  std::runtime_error::runtime_error(prVar2,(string *)&local_e8);
  *(undefined ***)prVar2 = &PTR__runtime_error_009902b8;
  *(undefined4 *)(prVar2 + 0x10) = (undefined4)local_c8.super_string_view._M_len;
  *(undefined4 *)(prVar2 + 0x14) = local_c8.super_string_view._M_len._4_4_;
  *(undefined4 *)(prVar2 + 0x18) = local_c8.super_string_view._M_str._0_4_;
  *(undefined4 *)(prVar2 + 0x1c) = local_c8.super_string_view._M_str._4_4_;
  *(undefined8 *)(prVar2 + 0x20) = local_b8;
  __cxa_throw(prVar2,&(anonymous_namespace)::json_error::typeinfo,std::runtime_error::~runtime_error
             );
}

Assistant:

int ParseIndex(
  const std::string& str, cm::optional<Args> const& progress = cm::nullopt,
  Json::ArrayIndex max = std::numeric_limits<Json::ArrayIndex>::max())
{
  unsigned long lindex;
  if (!cmStrToULong(str, &lindex)) {
    throw json_error(cmStrCat("expected an array index, got: '"_s, str, "'"_s),
                     progress);
  }
  Json::ArrayIndex index = static_cast<Json::ArrayIndex>(lindex);
  if (index >= max) {
    cmAlphaNum sizeStr{ max };
    throw json_error(cmStrCat("expected an index less than "_s, sizeStr.View(),
                              " got '"_s, str, "'"_s),
                     progress);
  }
  return index;
}